

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void * __thiscall
vector<NodeList<Node>_>::realloc(vector<NodeList<Node>_> *this,void *__ptr,size_t __size)

{
  uint uVar1;
  NodeList<Node> *in_RAX;
  ulong *puVar2;
  vector<Node> *pvVar3;
  NodeList<Node> *pNVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar1 = (uint)__ptr;
  }
  if (this->_capacity != uVar1) {
    uVar6 = (ulong)uVar1;
    puVar2 = (ulong *)operator_new__(uVar6 * 0x18 + 8);
    *puVar2 = uVar6;
    in_RAX = (NodeList<Node> *)(puVar2 + 1);
    lVar5 = 0;
    pNVar4 = in_RAX;
    do {
      NodeList<Node>::NodeList(pNVar4);
      lVar5 = lVar5 + -0x18;
      pNVar4 = pNVar4 + 1;
    } while (uVar6 * -0x18 - lVar5 != 0);
    if (0 < this->_size) {
      pvVar3 = vector<Node>::operator=((vector<Node> *)in_RAX,&this->vect->nodes);
      if (lVar5 != 0) {
        lVar5 = -lVar5;
        do {
          vector<Node>::~vector((vector<Node> *)((long)puVar2 + lVar5 + -0x10));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != 0);
      }
      operator_delete__(puVar2);
      _Unwind_Resume(pvVar3);
    }
    this->_capacity = uVar1;
    pNVar4 = this->vect;
    if (pNVar4 != (NodeList<Node> *)0x0) {
      if (*(long *)&pNVar4[-1]._currNode != 0) {
        lVar5 = *(long *)&pNVar4[-1]._currNode * 0x18;
        do {
          vector<Node>::~vector((vector<Node> *)((long)&pNVar4[-1].nodes.vect + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != 0);
      }
      operator_delete__(&pNVar4[-1]._currNode);
    }
    this->vect = in_RAX;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}